

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testlab5.c
# Opt level: O3

int CheckCompressBig1(void)

{
  int iVar1;
  uint uVar2;
  uint uVar3;
  byte bVar4;
  int iVar5;
  
  uVar2 = CalcFib(0);
  iVar5 = (AlphabetSize - 1) * uVar2;
  if (1 < AlphabetSize) {
    uVar2 = 1;
    bVar4 = 2;
    do {
      uVar3 = CalcFib(uVar2);
      iVar5 = iVar5 + (AlphabetSize - uVar2) * uVar3;
      uVar2 = (uint)bVar4;
      bVar4 = bVar4 + 1;
    } while (uVar2 < AlphabetSize);
  }
  if ((int)AlphabetSize < 0x1a) {
    if (AlphabetSize == 0x10) {
      uVar2 = 0x15;
      goto LAB_001025db;
    }
    if (AlphabetSize == 0x15) {
      uVar2 = 0x1a;
      goto LAB_001025db;
    }
  }
  else {
    if (AlphabetSize == 0x1a) {
      uVar2 = 0x1f;
      goto LAB_001025db;
    }
    if (AlphabetSize == 0x1f) {
      uVar2 = 0x23;
      goto LAB_001025db;
    }
  }
  uVar2 = 0x29;
LAB_001025db:
  iVar1 = AlphabetSize * 10;
  AlphabetSize = uVar2;
  iVar5 = CheckCompress((ulong)((iVar5 + iVar1 + 7U >> 3) + 4));
  return iVar5;
}

Assistant:

static int CheckCompressBig1(void) {
    unsigned bits = CalcFib(0)*(AlphabetSize-1);
    for (unsigned char c = 1; c < AlphabetSize; ++c) {
        bits += CalcFib(c)*(AlphabetSize-c);
    }
    int expectedLength = 4+(10*AlphabetSize+bits+7)/8;
    AlphabetSize = AlphabetSize == 16 ? 21
        : AlphabetSize == 21 ? 26
        : AlphabetSize == 26 ? 31
        : AlphabetSize == 31 ? 35
        : AlphabetSize == 35 ? 41
        : 41;
    return CheckCompress(expectedLength);
}